

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataflow.cpp
# Opt level: O2

BinaryOp * __thiscall nwcpp::Dataflow::CreateBinaryOp(Dataflow *this,char op,Node *lhs,Node *rhs)

{
  Passkey PVar1;
  Passkey passkey;
  char local_41;
  _Head_base<0UL,_nwcpp::Node_*,_false> local_40;
  Passkey local_38;
  Dataflow *local_30;
  Node *local_28;
  Node *local_20;
  
  local_41 = op;
  local_30 = this;
  local_28 = rhs;
  local_20 = lhs;
  std::make_unique<nwcpp::BinaryOp,nwcpp::Passkey&,char&,nwcpp::Node_const*&,nwcpp::Node_const*&>
            (&local_38,(char *)&local_30,(Node **)&local_41,&local_20);
  PVar1.dag = local_38.dag;
  local_38.dag = (Dataflow *)0x0;
  local_40._M_head_impl = (Node *)PVar1.dag;
  std::
  vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
  ::emplace_back<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>
            ((vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
              *)&this->nodes_,
             (unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_> *)&local_40);
  if ((Dataflow *)local_40._M_head_impl != (Dataflow *)0x0) {
    (*(*(_func_int ***)
        &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>_>_>
            *)&(local_40._M_head_impl)->_vptr_Node)->_M_t)._M_impl)[1])();
  }
  if (local_38.dag != (Dataflow *)0x0) {
    (**(code **)(*(long *)&((local_38.dag)->variables_)._M_t._M_impl + 8))();
  }
  return (BinaryOp *)PVar1.dag;
}

Assistant:

BinaryOp* Dataflow::CreateBinaryOp(char op, const Node* lhs, const Node* rhs) {
  Passkey passkey(this);
  auto operation = std::make_unique<BinaryOp>(passkey, op, lhs, rhs);
  const auto ptr = operation.get();
  nodes_.push_back(std::move(operation));
  return ptr;
}